

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O0

void __thiscall
TxIn_EstimateTxInVsize_Test::~TxIn_EstimateTxInVsize_Test(TxIn_EstimateTxInVsize_Test *this)

{
  TxIn_EstimateTxInVsize_Test *this_local;
  
  ~TxIn_EstimateTxInVsize_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TxIn, EstimateTxInVsize) {
  static const std::vector<TestEstimateTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script()},
    {AddressType::kP2shAddress, 208, 0, exp_script},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script()},
    {AddressType::kP2shP2wshAddress, 112, 0, Script("51")},
    {AddressType::kP2wpkhAddress, 69, 0, Script()},
    {AddressType::kP2wshAddress, 83, 0, exp_script},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    EXPECT_NO_THROW((vsize = TxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script)));
    EXPECT_EQ(vsize, test_data.size);
  }
}